

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFieldByName(DescriptorPool *this,string_view name)

{
  Symbol SVar1;
  Symbol SVar2;
  
  SVar1 = Tables::FindByNameHelper
                    ((this->tables_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                     .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                     _M_head_impl,this,name);
  SVar2.ptr_ = &((FieldDescriptor *)0x0)->super_SymbolBase;
  if ((SVar1.ptr_)->symbol_type_ == '\x02') {
    SVar2 = SVar1;
  }
  if (((FieldDescriptor *)SVar2.ptr_ == (FieldDescriptor *)0x0) ||
     ((((FieldDescriptor *)SVar2.ptr_)->field_0x1 & 8) != 0)) {
    SVar2.ptr_ = (SymbolBase *)0x0;
  }
  return (FieldDescriptor *)SVar2.ptr_;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindFieldByName(
    absl::string_view name) const {
  if (const FieldDescriptor* field =
          tables_->FindByNameHelper(this, name).field_descriptor()) {
    if (!field->is_extension()) {
      return field;
    }
  }
  return nullptr;
}